

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O3

bool __thiscall ScapeGoatTree::removeBST(ScapeGoatTree *this,int value)

{
  Node *child;
  Node *pNVar1;
  Node *pNVar2;
  Node *loc;
  Node *par;
  
  loc = this->root;
  if (loc == (Node *)0x0) {
    return false;
  }
  if (loc->value == value) {
    par = (Node *)0x0;
  }
  else {
    pNVar1 = (&loc->rightChild)[value < loc->value];
    par = loc;
    while( true ) {
      loc = pNVar1;
      if (loc == (Node *)0x0) {
        return false;
      }
      if (loc->value == value) break;
      pNVar1 = (&loc->rightChild)[value < loc->value];
      par = loc;
    }
  }
  pNVar1 = loc->leftChild;
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = loc->rightChild;
    if (pNVar1 == (Node *)0x0) {
      pNVar1 = (Node *)this;
      if ((par != (Node *)0x0) && (pNVar1 = (Node *)&par->leftChild, par->leftChild != loc)) {
        pNVar1 = par;
      }
      pNVar1->rightChild = (Node *)0x0;
      pNVar1 = loc->leftChild;
      if (pNVar1 != (Node *)0x0) goto LAB_001069ca;
LAB_00106a55:
      pNVar1 = loc->rightChild;
      if (pNVar1 == (Node *)0x0) goto LAB_00106a89;
    }
    pNVar2 = (Node *)this;
    if ((par != (Node *)0x0) && (pNVar2 = (Node *)&par->leftChild, par->leftChild != loc)) {
      pNVar2 = par;
    }
    pNVar2->rightChild = pNVar1;
    if (loc->leftChild == (Node *)0x0) goto LAB_00106a89;
LAB_00106a7b:
    if (loc->rightChild == (Node *)0x0) goto LAB_00106a89;
  }
  else {
LAB_001069ca:
    if (loc->rightChild == (Node *)0x0) {
      pNVar2 = (Node *)this;
      if ((par != (Node *)0x0) && (pNVar2 = (Node *)&par->leftChild, par->leftChild != loc)) {
        pNVar2 = par;
      }
      pNVar2->rightChild = pNVar1;
      if (loc->leftChild == (Node *)0x0) goto LAB_00106a55;
      goto LAB_00106a7b;
    }
  }
  caseC(this,par,loc);
LAB_00106a89:
  operator_delete(loc,0x20);
  return true;
}

Assistant:

bool ScapeGoatTree::removeBST(int value) {
    Node *parent, *location;
    if (root == nullptr) {
        return false;
    }
    find(value, &parent, &location);
    if (location == nullptr) {
        return false;
    }
    if (location->leftChild == nullptr && location->rightChild == nullptr) {
        caseA(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild == nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild == nullptr && location->rightChild != nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild != nullptr) {
        caseC(parent, location);
    }
    delete location;
    return true;
}